

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_node_short_edge
          (REF_GRID ref_grid,REF_INT node,REF_DBL *short_edge,REF_DBL *short_diag,REF_INT *short_id)

{
  long lVar1;
  int geom;
  REF_CELL pRVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  REF_DBL diag;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  *short_edge = 1.0;
  *short_diag = 1e+200;
  *short_id = -1;
  dVar7 = -1e+200;
  local_48 = 1e+200;
  if (((-1 < node) && (pRVar2 = ref_grid->cell[10], node < (int)pRVar2->type)) &&
     (lVar4 = (long)*(int *)(*(long *)&pRVar2->size_per + (ulong)(uint)node * 4), lVar4 != -1)) {
    lVar1 = *(long *)&pRVar2->edge_per + lVar4 * 8;
    local_48 = 1e+200;
    uStack_40 = 0;
    dVar8 = -1e+200;
    while( true ) {
      geom = *(int *)(lVar1 + 4);
      dVar7 = dVar8;
      if ((&ref_grid->cell[0]->type)[(long)geom * 6] == REF_CELL_ED2) {
        uVar3 = ref_egads_diagonal((REF_GEOM)ref_grid,geom,&local_50);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xa74,"ref_geom_node_short_edge",(ulong)uVar3,"edge diag");
          return uVar3;
        }
        if (local_50 < local_48) {
          *short_diag = local_50;
          *short_id = (&ref_grid->cell[0]->type)[(int)(geom * 6 | 1)];
          uStack_40 = 0;
          local_48 = local_50;
        }
        dVar7 = local_50;
        if (local_50 <= dVar8) {
          dVar7 = dVar8;
        }
      }
      lVar1 = *(long *)&ref_grid->cell[10]->edge_per;
      lVar4 = (long)*(int *)(lVar1 + (long)(int)lVar4 * 8);
      if (lVar4 == -1) break;
      lVar1 = lVar1 + lVar4 * 8;
      dVar8 = dVar7;
    }
  }
  auVar5._0_8_ = dVar7 * 1e+20;
  auVar5._8_8_ = local_48;
  auVar6._8_8_ = -local_48;
  auVar6._0_8_ = -auVar5._0_8_;
  auVar6 = maxpd(auVar5,auVar6);
  if (auVar6._8_8_ < auVar6._0_8_) {
    *short_edge = local_48 / dVar7;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_short_edge(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *short_edge,
                                                   REF_DBL *short_diag,
                                                   REF_INT *short_id) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, geom;
  REF_DBL diag, min_diag, max_diag;
  *short_edge = 1.0;
  *short_diag = REF_DBL_MAX;
  *short_id = REF_EMPTY;
  min_diag = REF_DBL_MAX;
  max_diag = REF_DBL_MIN;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_EDGE != ref_geom_type(ref_geom, geom)) continue;
    RSS(ref_egads_diagonal(ref_geom, geom, &diag), "edge diag");
    if (diag < min_diag) {
      min_diag = diag;
      *short_diag = diag;
      *short_id = ref_geom_id(ref_geom, geom);
    }
    max_diag = MAX(diag, max_diag);
  }
  if (ref_math_divisible(min_diag, max_diag)) {
    *short_edge = min_diag / max_diag;
  }
  return REF_SUCCESS;
}